

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.cpp
# Opt level: O0

void __thiscall CEObserver::init_members(CEObserver *this)

{
  long in_RDI;
  double dVar1;
  double in_stack_ffffffffffffff10;
  allocator_type *in_stack_ffffffffffffff18;
  allocator_type *__a;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  vector<double,_std::allocator<double>_> *this_00;
  size_type in_stack_ffffffffffffff28;
  undefined1 *__n;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> local_89;
  undefined1 local_61 [57];
  undefined8 local_28;
  undefined1 local_20 [32];
  
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  dVar1 = CppEphem::SeaLevelTemp_C();
  *(double *)(in_RDI + 0x28) = dVar1;
  dVar1 = CppEphem::EstimatePressure_hPa(in_stack_ffffffffffffff10);
  *(double *)(in_RDI + 0x20) = dVar1;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0x3fe0000000000000;
  dVar1 = CETime::SystemUTCOffset_hrs();
  *(double *)(in_RDI + 0xa8) = dVar1;
  *(undefined8 *)(in_RDI + 0x40) = 0xc6293e5939a08cea;
  local_28 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x1391cb);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (value_type *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  __n = local_20;
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_ffffffffffffff20,
             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff18);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff20);
  std::allocator<double>::~allocator((allocator<double> *)0x13921e);
  local_61._1_8_ = 0;
  this_01 = (vector<double,_std::allocator<double>_> *)local_61;
  std::allocator<double>::allocator((allocator<double> *)0x13923c);
  std::vector<double,_std::allocator<double>_>::vector
            (this_01,(size_type)__n,(value_type *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  __a = (allocator_type *)(local_61 + 9);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_ffffffffffffff20,(vector<double,_std::allocator<double>_> *)__a);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff20);
  std::allocator<double>::~allocator((allocator<double> *)0x13928f);
  local_89.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._1_8_
       = 0;
  this_00 = &local_89;
  std::allocator<double>::allocator((allocator<double> *)0x1392a7);
  std::vector<double,_std::allocator<double>_>::vector
            (this_01,(size_type)__n,(value_type *)this_00,__a);
  std::vector<double,_std::allocator<double>_>::operator=
            (this_00,(vector<double,_std::allocator<double>_> *)__a);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::allocator<double>::~allocator((allocator<double> *)0x1392ec);
  std::allocator<double>::allocator((allocator<double> *)0x139304);
  std::vector<double,_std::allocator<double>_>::vector
            (this_01,(size_type)__n,(value_type *)this_00,__a);
  std::vector<double,_std::allocator<double>_>::operator=
            (this_00,(vector<double,_std::allocator<double>_> *)__a);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::allocator<double>::~allocator((allocator<double> *)0x139349);
  return;
}

Assistant:

void CEObserver::init_members(void)
{
    longitude_           = 0.0;
    latitude_            = 0.0;
    elevation_m_         = 0.0;
    temperature_celsius_ = CppEphem::SeaLevelTemp_C();
    pressure_hPa_        = CppEphem::EstimatePressure_hPa(elevation_m_);
    relative_humidity_   = 0.0;
    wavelength_um_       = 0.5;
    utc_offset_          = CETime::SystemUTCOffset_hrs();

    // cached pos/vel parameters
    cache_date_ = -1.0e30;
    pos_cirs_   = std::vector<double>(3, 0.0);
    pos_icrs_   = std::vector<double>(3, 0.0);
    vel_cirs_   = std::vector<double>(3, 0.0);
    vel_icrs_   = std::vector<double>(3, 0.0);
}